

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O2

bool __thiscall
tinyusdz::tydra::RenderSceneConverter::ConvertPreviewSurfaceShader
          (RenderSceneConverter *this,RenderSceneConverterEnv *env,Path *shader_abs_path,
          UsdPreviewSurface *shader,PreviewSurfaceShader *rshader_out)

{
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *pTVar1;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *param;
  UsdPreviewSurface *pUVar2;
  bool bVar3;
  ostream *poVar4;
  Animatable<int> *this_00;
  char *pcVar5;
  int val;
  allocator local_291;
  string local_290;
  UsdPreviewSurface *local_270;
  PreviewSurfaceShader *local_268;
  undefined1 local_260 [4];
  ShaderParam<std::array<float,_3UL>_> local_25c;
  ShaderParam<std::array<float,_3UL>_> local_24c;
  ShaderParam<std::array<float,_3UL>_> local_23c;
  ShaderParam<float> SStack_22c;
  ShaderParam<float> local_224;
  ShaderParam<float> SStack_21c;
  ShaderParam<float> local_214;
  ShaderParam<float> SStack_20c;
  ShaderParam<float> local_204;
  ShaderParam<float> SStack_1fc;
  ShaderParam<std::array<float,_3UL>_> local_1f4;
  ShaderParam<float> SStack_1e4;
  ShaderParam<float> local_1dc;
  undefined8 local_1d0;
  string local_1c8;
  ostringstream ss_e;
  
  if (rshader_out == (PreviewSurfaceShader *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ConvertPreviewSurfaceShader");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1323);
    ::std::operator<<(poVar4," ");
    poVar4 = ::std::operator<<((ostream *)&ss_e,"rshader_out arg is nullptr.");
    ::std::operator<<(poVar4,"\n");
  }
  else {
    local_260[0] = 0;
    local_25c.value._M_elems[0] = 0.18;
    local_25c.value._M_elems[1] = 0.18;
    local_25c.value._M_elems[2] = 0.18;
    local_25c.texture_id = -1;
    local_24c.value._M_elems[0] = 0.0;
    local_24c.value._M_elems[1] = 0.0;
    local_24c.value._M_elems[2] = 0.0;
    local_24c.texture_id = -1;
    local_23c.value._M_elems[0] = 0.0;
    local_23c.value._M_elems[1] = 0.0;
    local_23c.value._M_elems[2] = 0.0;
    local_23c.texture_id = -1;
    SStack_22c.value = 0.0;
    SStack_22c.texture_id = -1;
    local_224.value = 0.5;
    local_224.texture_id = -1;
    SStack_21c.value = 0.0;
    SStack_21c.texture_id = -1;
    local_214.value = 0.01;
    local_214.texture_id = -1;
    SStack_20c.value = 1.0;
    SStack_20c.texture_id = -1;
    local_204.value = 0.0;
    local_204.texture_id = -1;
    SStack_1fc.value = 1.5;
    SStack_1fc.texture_id = -1;
    local_1f4.value._M_elems[0] = 0.0;
    local_1f4.value._M_elems[1] = 0.0;
    local_1f4.value._M_elems[2] = 1.0;
    local_1f4.texture_id = -1;
    SStack_1e4.value = 0.0;
    SStack_1e4.texture_id = -1;
    local_1dc.value = 0.0;
    local_1dc.texture_id = -1;
    local_1d0 = 0;
    bVar3 = TypedAttributeWithFallback<tinyusdz::Animatable<int>_>::authored
                      (&shader->useSpecularWorkflow);
    if (!bVar3) {
LAB_0029c5e3:
      local_270 = shader;
      local_268 = rshader_out;
      ::std::__cxx11::string::string((string *)&ss_e,"diffuseColor",(allocator *)&local_290);
      bVar3 = ConvertPreviewSurfaceShaderParam<tinyusdz::value::color3f,std::array<float,3ul>>
                        (this,env,shader_abs_path,&shader->diffuseColor,(string *)&ss_e,&local_25c);
      ::std::__cxx11::string::_M_dispose();
      if (!bVar3) {
        return false;
      }
      pTVar1 = &local_270->emissiveColor;
      ::std::__cxx11::string::string((string *)&ss_e,"emissiveColor",(allocator *)&local_290);
      bVar3 = ConvertPreviewSurfaceShaderParam<tinyusdz::value::color3f,std::array<float,3ul>>
                        (this,env,shader_abs_path,pTVar1,(string *)&ss_e,&local_24c);
      ::std::__cxx11::string::_M_dispose();
      if (!bVar3) {
        return false;
      }
      pTVar1 = &local_270->specularColor;
      ::std::__cxx11::string::string((string *)&ss_e,"specularColor",(allocator *)&local_290);
      bVar3 = ConvertPreviewSurfaceShaderParam<tinyusdz::value::color3f,std::array<float,3ul>>
                        (this,env,shader_abs_path,pTVar1,(string *)&ss_e,&local_23c);
      ::std::__cxx11::string::_M_dispose();
      pUVar2 = local_270;
      if (!bVar3) {
        return false;
      }
      param = &local_270->normal;
      ::std::__cxx11::string::string((string *)&ss_e,"normal",(allocator *)&local_290);
      bVar3 = ConvertPreviewSurfaceShaderParam<tinyusdz::value::normal3f,std::array<float,3ul>>
                        (this,env,shader_abs_path,param,(string *)&ss_e,&local_1f4);
      ::std::__cxx11::string::_M_dispose();
      if (!bVar3) {
        return false;
      }
      ::std::__cxx11::string::string((string *)&ss_e,"roughness",(allocator *)&local_290);
      bVar3 = ConvertPreviewSurfaceShaderParam<float,float>
                        (this,env,shader_abs_path,&pUVar2->roughness,(string *)&ss_e,&local_224);
      ::std::__cxx11::string::_M_dispose();
      if (!bVar3) {
        return false;
      }
      ::std::__cxx11::string::string((string *)&ss_e,"metallic",(allocator *)&local_290);
      bVar3 = ConvertPreviewSurfaceShaderParam<float,float>
                        (this,env,shader_abs_path,&pUVar2->metallic,(string *)&ss_e,&SStack_22c);
      ::std::__cxx11::string::_M_dispose();
      if (!bVar3) {
        return false;
      }
      ::std::__cxx11::string::string((string *)&ss_e,"clearcoat",(allocator *)&local_290);
      bVar3 = ConvertPreviewSurfaceShaderParam<float,float>
                        (this,env,shader_abs_path,&pUVar2->clearcoat,(string *)&ss_e,&SStack_21c);
      ::std::__cxx11::string::_M_dispose();
      if (!bVar3) {
        return false;
      }
      ::std::__cxx11::string::string((string *)&ss_e,"clearcoatRoughness",(allocator *)&local_290);
      bVar3 = ConvertPreviewSurfaceShaderParam<float,float>
                        (this,env,shader_abs_path,&pUVar2->clearcoatRoughness,(string *)&ss_e,
                         &local_214);
      ::std::__cxx11::string::_M_dispose();
      if (!bVar3) {
        return false;
      }
      ::std::__cxx11::string::string((string *)&ss_e,"opacity",(allocator *)&local_290);
      bVar3 = ConvertPreviewSurfaceShaderParam<float,float>
                        (this,env,shader_abs_path,&pUVar2->opacity,(string *)&ss_e,&SStack_20c);
      ::std::__cxx11::string::_M_dispose();
      if (!bVar3) {
        return false;
      }
      ::std::__cxx11::string::string((string *)&ss_e,"opacityThreshold",(allocator *)&local_290);
      bVar3 = ConvertPreviewSurfaceShaderParam<float,float>
                        (this,env,shader_abs_path,&pUVar2->opacityThreshold,(string *)&ss_e,
                         &local_204);
      ::std::__cxx11::string::_M_dispose();
      if (!bVar3) {
        return false;
      }
      ::std::__cxx11::string::string((string *)&ss_e,"ior",(allocator *)&local_290);
      bVar3 = ConvertPreviewSurfaceShaderParam<float,float>
                        (this,env,shader_abs_path,&pUVar2->ior,(string *)&ss_e,&SStack_1fc);
      ::std::__cxx11::string::_M_dispose();
      if (!bVar3) {
        return false;
      }
      ::std::__cxx11::string::string((string *)&ss_e,"occlusion",(allocator *)&local_290);
      bVar3 = ConvertPreviewSurfaceShaderParam<float,float>
                        (this,env,shader_abs_path,&pUVar2->occlusion,(string *)&ss_e,&local_1dc);
      ::std::__cxx11::string::_M_dispose();
      if (!bVar3) {
        return false;
      }
      ::std::__cxx11::string::string((string *)&ss_e,"displacement",(allocator *)&local_290);
      bVar3 = ConvertPreviewSurfaceShaderParam<float,float>
                        (this,env,shader_abs_path,&pUVar2->displacement,(string *)&ss_e,&SStack_1e4)
      ;
      ::std::__cxx11::string::_M_dispose();
      if (!bVar3) {
        return false;
      }
      memcpy(local_268,local_260,0x98);
      return true;
    }
    if ((shader->useSpecularWorkflow)._blocked == true) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ConvertPreviewSurfaceShader");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x132b);
      ::std::operator<<(poVar4," ");
      pcVar5 = "useSpecularWorkflow attribute is blocked.";
    }
    else {
      if (((shader->useSpecularWorkflow)._paths.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish ==
           (shader->useSpecularWorkflow)._paths.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_start) || (((shader->useSpecularWorkflow)._empty & 1U) == 0))
      {
        this_00 = TypedAttributeWithFallback<tinyusdz::Animatable<int>_>::get_value
                            (&shader->useSpecularWorkflow);
        bVar3 = Animatable<int>::get(this_00,env->timecode,&val,Linear);
        if (bVar3) {
          local_260[0] = val != 0;
          goto LAB_0029c5e3;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ConvertPreviewSurfaceShader");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1334);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_1c8,"Failed to get useSpcularWorkflow value at time `{}`.",
                   &local_291);
        fmt::format<double>(&local_290,&local_1c8,&env->timecode);
        poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_290);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)&this->_err);
        ::std::__cxx11::string::_M_dispose();
        goto LAB_0029c5a6;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ConvertPreviewSurfaceShader");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x132e);
      ::std::operator<<(poVar4," ");
      pcVar5 = "TODO: useSpecularWorkflow with connection.";
    }
    ::std::__cxx11::string::string((string *)&local_1c8,pcVar5,(allocator *)&val);
    fmt::format(&local_290,&local_1c8);
    poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_290);
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::append((string *)&this->_err);
  ::std::__cxx11::string::_M_dispose();
LAB_0029c5a6:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  return false;
}

Assistant:

bool RenderSceneConverter::ConvertPreviewSurfaceShader(
    const RenderSceneConverterEnv &env, const Path &shader_abs_path,
    const UsdPreviewSurface &shader, PreviewSurfaceShader *rshader_out) {
  if (!rshader_out) {
    PUSH_ERROR_AND_RETURN("rshader_out arg is nullptr.");
  }

  PreviewSurfaceShader rshader;

  if (shader.useSpecularWorkflow.authored()) {
    if (shader.useSpecularWorkflow.is_blocked()) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("useSpecularWorkflow attribute is blocked."));
    } else if (shader.useSpecularWorkflow.is_connection()) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("TODO: useSpecularWorkflow with connection."));
    } else {
      int val;
      if (!shader.useSpecularWorkflow.get_value().get(env.timecode, &val)) {
        PUSH_ERROR_AND_RETURN(
            fmt::format("Failed to get useSpcularWorkflow value at time `{}`.",
                        env.timecode));
      }

      rshader.useSpecularWorkflow = val ? true : false;
    }
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path,
                                        shader.diffuseColor, "diffuseColor",
                                        rshader.diffuseColor)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path,
                                        shader.emissiveColor, "emissiveColor",
                                        rshader.emissiveColor)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path,
                                        shader.specularColor, "specularColor",
                                        rshader.specularColor)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path, shader.normal,
                                        "normal", rshader.normal)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path, shader.roughness,
                                        "roughness", rshader.roughness)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path, shader.metallic,
                                        "metallic", rshader.metallic)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path, shader.clearcoat,
                                        "clearcoat", rshader.clearcoat)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(
          env, shader_abs_path, shader.clearcoatRoughness, "clearcoatRoughness",
          rshader.clearcoatRoughness)) {
    return false;
  }
  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path, shader.opacity,
                                        "opacity", rshader.opacity)) {
    return false;
  }
  if (!ConvertPreviewSurfaceShaderParam(
          env, shader_abs_path, shader.opacityThreshold, "opacityThreshold",
          rshader.opacityThreshold)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path, shader.ior, "ior",
                                        rshader.ior)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path, shader.occlusion,
                                        "occlusion", rshader.occlusion)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path,
                                        shader.displacement, "displacement",
                                        rshader.displacement)) {
    return false;
  }

  (*rshader_out) = rshader;
  return true;
}